

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_interface_block_in_struct
          (CompilerHLSL *this,SPIRVariable *var,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *active_locations)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  CompilerError *pCVar4;
  Bitset *pBVar5;
  uint *itr;
  bool *itr_00;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690 [32];
  _Node_iterator_base<unsigned_int,_false> local_670;
  undefined1 local_668;
  value_type local_65c;
  uint local_658;
  uint local_654;
  uint32_t i_1;
  uint32_t consumed_locations;
  uint32_t local_62c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628 [36];
  uint32_t local_604;
  undefined1 local_600 [8];
  SPIRType decl_type;
  ExecutionModel local_48c;
  spirv_cross local_488 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468 [36];
  uint32_t local_444;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440 [32];
  spirv_cross local_420 [32];
  undefined1 local_400 [40];
  string effective_semantic;
  undefined1 local_3c0 [8];
  SPIRType newtype;
  undefined1 local_258 [4];
  uint32_t i;
  string semantic;
  ExecutionModel local_22c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228 [4];
  uint32_t location_number;
  string name;
  anon_class_8_1_33ba97e3 local_208;
  anon_class_8_1_33ba97e3 get_vacant_location;
  char *local_1f8;
  spirv_cross local_1f0 [36];
  uint32_t local_1cc;
  uint32_t local_1c8;
  uint32_t location;
  uint32_t local_1b4;
  uint32_t local_1b0;
  byte local_1ab;
  byte local_1aa;
  byte local_1a9;
  uint32_t index;
  bool legacy;
  bool need_matrix_unroll;
  bool use_location_number;
  string binding;
  undefined1 local_188 [8];
  SPIRType type;
  SPIREntryPoint *execution;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *active_locations_local;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get_entry_point((Compiler *)this);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  SPIRType::SPIRType((SPIRType *)local_188,pSVar3);
  ::std::__cxx11::string::string((string *)&index);
  local_1a9 = 1;
  local_1aa = 0;
  local_1ab = (this->hlsl_options).shader_model < 0x1f;
  if ((*(int *)&type.member_name_cache._M_h._M_single_bucket[0x1d]._M_nxt == 4) &&
     (var->storage == StorageClassOutput)) {
    local_1b4 = (var->super_IVariant).self.id;
    local_1b0 = Compiler::get_decoration((Compiler *)this,(ID)local_1b4,DecorationIndex);
    local_1cc = (var->super_IVariant).self.id;
    local_1c8 = Compiler::get_decoration((Compiler *)this,(ID)local_1cc,DecorationLocation);
    if ((local_1b0 != 0) && (local_1c8 != 0)) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar4,"Dual-source blending is only supported on MRT #0 in HLSL.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    local_1f8 = "SV_Target";
    if ((local_1ab & 1) != 0) {
      local_1f8 = "COLOR";
    }
    get_vacant_location.active_locations._4_4_ = local_1c8 + local_1b0;
    join<char_const*,unsigned_int>
              (local_1f0,&local_1f8,(uint *)((long)&get_vacant_location.active_locations + 4));
    ::std::__cxx11::string::operator=((string *)&index,(string *)local_1f0);
    ::std::__cxx11::string::~string((string *)local_1f0);
    local_1a9 = 0;
    if ((local_1ab & 1) != 0) {
      type.basetype = UByte;
    }
  }
  else if ((var->storage == StorageClassInput) &&
          ((*(int *)&type.member_name_cache._M_h._M_single_bucket[0x1d]._M_nxt == 0 &&
           (local_1aa = 1, (bool)local_1ab)))) {
    type.super_IVariant.self.id = 0xd;
  }
  local_208.active_locations = active_locations;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_228,this,(ulong)uVar2,1);
  if ((local_1a9 & 1) == 0) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
              (local_690,this,local_188,local_228,0);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,local_690,(char (*) [4])0x412b5f,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
               (char (*) [2])0x42463b);
    ::std::__cxx11::string::~string((string *)local_690);
    goto LAB_0023b526;
  }
  bVar1 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
  if (bVar1) {
    local_22c = Compiler::get_decoration
                          ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
  }
  else {
    local_22c = emit_interface_block_in_struct::anon_class_8_1_33ba97e3::operator()(&local_208);
  }
  to_semantic_abi_cxx11_
            ((CompilerHLSL *)local_258,(uint32_t)this,local_22c,
             *(StorageClass *)&type.member_name_cache._M_h._M_single_bucket[0x1d]._M_nxt);
  if (((local_1aa & 1) == 0) || (type.width < 2)) {
    SPIRType::SPIRType((SPIRType *)local_600,(SPIRType *)local_188);
    if (*(int *)&type.member_name_cache._M_h._M_single_bucket[0x1d]._M_nxt == 0x14f5) {
LAB_0023b246:
      itr = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)&decl_type.vecsize);
      SmallVector<unsigned_int,_8UL>::erase
                ((SmallVector<unsigned_int,_8UL> *)&decl_type.vecsize,itr);
      itr_00 = VectorView<bool>::begin
                         ((VectorView<bool> *)(decl_type.array.stack_storage.aligned_char + 0x18));
      SmallVector<bool,_8UL>::erase
                ((SmallVector<bool,_8UL> *)(decl_type.array.stack_storage.aligned_char + 0x18),
                 itr_00);
    }
    else {
      local_604 = (var->super_IVariant).self.id;
      bVar1 = Compiler::has_decoration((Compiler *)this,(ID)local_604,DecorationPerVertexKHR);
      if (bVar1) goto LAB_0023b246;
    }
    local_62c = (var->super_IVariant).self.id;
    pBVar5 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_62c);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x36])(local_628,this,pBVar5);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
              (&i_1,this,local_600,local_228,0);
    CompilerGLSL::
    statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,local_628,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,
               (char (*) [4])0x412b5f,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
               (char (*) [2])0x42463b);
    ::std::__cxx11::string::~string((string *)&i_1);
    ::std::__cxx11::string::~string((string *)local_628);
    local_654 = type_to_consumed_locations(this,(SPIRType *)local_600);
    for (local_658 = 0; local_658 < local_654; local_658 = local_658 + 1) {
      local_65c = local_22c + local_658;
      pVar6 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(active_locations,&local_65c);
      local_670._M_cur =
           (__node_type *)pVar6.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_668 = pVar6.second;
    }
    SPIRType::~SPIRType((SPIRType *)local_600);
  }
  else {
    bVar1 = VectorView<unsigned_int>::empty((VectorView<unsigned_int> *)&type.vecsize);
    if (!bVar1) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar4,"Arrays of matrices used as input/output. This is not supported.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    for (newtype.member_name_cache._M_h._M_single_bucket._4_4_ = 0;
        newtype.member_name_cache._M_h._M_single_bucket._4_4_ < type.width;
        newtype.member_name_cache._M_h._M_single_bucket._4_4_ =
             newtype.member_name_cache._M_h._M_single_bucket._4_4_ + 1) {
      SPIRType::SPIRType((SPIRType *)local_3c0,(SPIRType *)local_188);
      newtype.width = 1;
      ::std::__cxx11::string::string((string *)(local_400 + 0x20));
      if (((this->hlsl_options).flatten_matrix_vertex_input_semantics & 1U) == 0) {
        join<std::__cxx11::string&,char_const(&)[2],unsigned_int&>
                  (local_420,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                   (char (*) [2])0x40fecd,
                   (uint *)((long)&newtype.member_name_cache._M_h._M_single_bucket + 4));
        ::std::__cxx11::string::operator=((string *)(local_400 + 0x20),(string *)local_420);
        ::std::__cxx11::string::~string((string *)local_420);
      }
      else {
        to_semantic_abi_cxx11_
                  ((CompilerHLSL *)local_400,(uint32_t)this,local_22c,
                   *(StorageClass *)&type.member_name_cache._M_h._M_single_bucket[0x1d]._M_nxt);
        ::std::__cxx11::string::operator=((string *)(local_400 + 0x20),(string *)local_400);
        ::std::__cxx11::string::~string((string *)local_400);
      }
      local_444 = (var->super_IVariant).self.id;
      pBVar5 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_444);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x36])(local_440,this,pBVar5);
      join<std::__cxx11::string&,char_const(&)[2],unsigned_int&>
                (local_488,local_228,(char (*) [2])0x40fecd,
                 (uint *)((long)&newtype.member_name_cache._M_h._M_single_bucket + 4));
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                (local_468,this,local_3c0,local_488,0);
      CompilerGLSL::
      statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                (&this->super_CompilerGLSL,local_440,local_468,(char (*) [4])0x412b5f,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_400 + 0x20),(char (*) [2])0x42463b);
      ::std::__cxx11::string::~string((string *)local_468);
      ::std::__cxx11::string::~string((string *)local_488);
      ::std::__cxx11::string::~string((string *)local_440);
      local_48c = local_22c;
      pVar6 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(active_locations,&local_48c);
      decl_type.member_name_cache._M_h._M_single_bucket =
           (__node_base_ptr)pVar6.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      ::std::__cxx11::string::~string((string *)(local_400 + 0x20));
      SPIRType::~SPIRType((SPIRType *)local_3c0);
      local_22c = local_22c + ExecutionModelTessellationControl;
    }
  }
  ::std::__cxx11::string::~string((string *)local_258);
LAB_0023b526:
  ::std::__cxx11::string::~string((string *)local_228);
  ::std::__cxx11::string::~string((string *)&index);
  SPIRType::~SPIRType((SPIRType *)local_188);
  return;
}

Assistant:

void CompilerHLSL::emit_interface_block_in_struct(const SPIRVariable &var, unordered_set<uint32_t> &active_locations)
{
	auto &execution = get_entry_point();
	auto type = get<SPIRType>(var.basetype);

	string binding;
	bool use_location_number = true;
	bool need_matrix_unroll = false;
	bool legacy = hlsl_options.shader_model <= 30;
	if (execution.model == ExecutionModelFragment && var.storage == StorageClassOutput)
	{
		// Dual-source blending is achieved in HLSL by emitting to SV_Target0 and 1.
		uint32_t index = get_decoration(var.self, DecorationIndex);
		uint32_t location = get_decoration(var.self, DecorationLocation);

		if (index != 0 && location != 0)
			SPIRV_CROSS_THROW("Dual-source blending is only supported on MRT #0 in HLSL.");

		binding = join(legacy ? "COLOR" : "SV_Target", location + index);
		use_location_number = false;
		if (legacy) // COLOR must be a four-component vector on legacy shader model targets (HLSL ERR_COLOR_4COMP)
			type.vecsize = 4;
	}
	else if (var.storage == StorageClassInput && execution.model == ExecutionModelVertex)
	{
		need_matrix_unroll = true;
		if (legacy) // Inputs must be floating-point in legacy targets.
			type.basetype = SPIRType::Float;
	}

	const auto get_vacant_location = [&]() -> uint32_t {
		for (uint32_t i = 0; i < 64; i++)
			if (!active_locations.count(i))
				return i;
		SPIRV_CROSS_THROW("All locations from 0 to 63 are exhausted.");
	};

	auto name = to_name(var.self);
	if (use_location_number)
	{
		uint32_t location_number;

		// If an explicit location exists, use it with TEXCOORD[N] semantic.
		// Otherwise, pick a vacant location.
		if (has_decoration(var.self, DecorationLocation))
			location_number = get_decoration(var.self, DecorationLocation);
		else
			location_number = get_vacant_location();

		// Allow semantic remap if specified.
		auto semantic = to_semantic(location_number, execution.model, var.storage);

		if (need_matrix_unroll && type.columns > 1)
		{
			if (!type.array.empty())
				SPIRV_CROSS_THROW("Arrays of matrices used as input/output. This is not supported.");

			// Unroll matrices.
			for (uint32_t i = 0; i < type.columns; i++)
			{
				SPIRType newtype = type;
				newtype.columns = 1;

				string effective_semantic;
				if (hlsl_options.flatten_matrix_vertex_input_semantics)
					effective_semantic = to_semantic(location_number, execution.model, var.storage);
				else
					effective_semantic = join(semantic, "_", i);

				statement(to_interpolation_qualifiers(get_decoration_bitset(var.self)),
				          variable_decl(newtype, join(name, "_", i)), " : ", effective_semantic, ";");
				active_locations.insert(location_number++);
			}
		}
		else
		{
			auto decl_type = type;
			if (execution.model == ExecutionModelMeshEXT || has_decoration(var.self, DecorationPerVertexKHR))
			{
				decl_type.array.erase(decl_type.array.begin());
				decl_type.array_size_literal.erase(decl_type.array_size_literal.begin());
			}
			statement(to_interpolation_qualifiers(get_decoration_bitset(var.self)), variable_decl(decl_type, name), " : ",
			          semantic, ";");

			// Structs and arrays should consume more locations.
			uint32_t consumed_locations = type_to_consumed_locations(decl_type);
			for (uint32_t i = 0; i < consumed_locations; i++)
				active_locations.insert(location_number + i);
		}
	}
	else
	{
		statement(variable_decl(type, name), " : ", binding, ";");
	}
}